

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubDVertex::HasInteriorVertexTopology(ON_SubDVertex *this)

{
  ushort uVar1;
  unsigned_short vei;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = this->m_edge_count;
  bVar4 = false;
  if ((1 < (ulong)uVar1) && (bVar4 = false, uVar1 == this->m_face_count)) {
    bVar4 = false;
    if ((this->m_edges != (ON_SubDEdgePtr *)0x0) && (this->m_faces != (ON_SubDFace **)0x0)) {
      uVar2 = 0;
      do {
        bVar4 = uVar1 == uVar2;
        if (bVar4) {
          return bVar4;
        }
        uVar3 = this->m_edges[uVar2].m_ptr & 0xfffffffffffffff8;
        if (uVar3 == 0) {
          return bVar4;
        }
        uVar2 = uVar2 + 1;
      } while (*(short *)(uVar3 + 100) == 2);
    }
  }
  return bVar4;
}

Assistant:

bool ON_SubDVertex::HasInteriorVertexTopology() const
{
  if (m_edge_count >= 2 && m_edge_count == m_face_count && nullptr != m_edges && nullptr != m_faces)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 2 != e->m_face_count)
        return false;
    }
    return true;
  }    
  return false;
}